

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3DriverBase::drawHardwareBuffer
          (COpenGL3DriverBase *this,SHWBufferLink *_HWBuffer)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long in_RSI;
  long *in_RDI;
  void *indexList;
  void *vertices;
  IMeshBuffer *mb;
  SHWBufferLink_opengl *HWBuffer;
  undefined8 local_30;
  undefined8 local_28;
  
  if (in_RSI != 0) {
    (**(code **)(*in_RDI + 0x358))(in_RDI,in_RSI);
    plVar1 = *(long **)(in_RSI + 8);
    local_28 = (**(code **)(*plVar1 + 0x18))();
    local_30 = (**(code **)(*plVar1 + 0x38))();
    if (*(int *)(in_RSI + 0x18) != 0) {
      (*GL.BindBuffer)(0x8892,*(GLuint *)(in_RSI + 0x28));
      local_28 = 0;
    }
    if (*(int *)(in_RSI + 0x1c) != 0) {
      (*GL.BindBuffer)(0x8893,*(GLuint *)(in_RSI + 0x2c));
      local_30 = 0;
    }
    uVar2 = (**(code **)(*plVar1 + 0x28))();
    uVar3 = (**(code **)(*plVar1 + 0xf0))();
    uVar4 = (**(code **)(*plVar1 + 0x10))();
    uVar5 = (**(code **)(*plVar1 + 0xe8))();
    uVar6 = (**(code **)(*plVar1 + 0x30))();
    (**(code **)(*in_RDI + 0x158))(in_RDI,local_28,uVar2,local_30,uVar3,uVar4,uVar5,uVar6);
    if (*(int *)(in_RSI + 0x18) != 0) {
      (*GL.BindBuffer)(0x8892,0);
    }
    if (*(int *)(in_RSI + 0x1c) != 0) {
      (*GL.BindBuffer)(0x8893,0);
    }
  }
  return;
}

Assistant:

void COpenGL3DriverBase::drawHardwareBuffer(SHWBufferLink *_HWBuffer)
{
	if (!_HWBuffer)
		return;

	SHWBufferLink_opengl *HWBuffer = static_cast<SHWBufferLink_opengl *>(_HWBuffer);

	updateHardwareBuffer(HWBuffer); // check if update is needed

	const scene::IMeshBuffer *mb = HWBuffer->MeshBuffer;
	const void *vertices = mb->getVertices();
	const void *indexList = mb->getIndices();

	if (HWBuffer->Mapped_Vertex != scene::EHM_NEVER) {
		GL.BindBuffer(GL_ARRAY_BUFFER, HWBuffer->vbo_verticesID);
		vertices = 0;
	}

	if (HWBuffer->Mapped_Index != scene::EHM_NEVER) {
		GL.BindBuffer(GL_ELEMENT_ARRAY_BUFFER, HWBuffer->vbo_indicesID);
		indexList = 0;
	}

	drawVertexPrimitiveList(vertices, mb->getVertexCount(),
			indexList, mb->getPrimitiveCount(),
			mb->getVertexType(), mb->getPrimitiveType(),
			mb->getIndexType());

	if (HWBuffer->Mapped_Vertex != scene::EHM_NEVER)
		GL.BindBuffer(GL_ARRAY_BUFFER, 0);

	if (HWBuffer->Mapped_Index != scene::EHM_NEVER)
		GL.BindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
}